

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS grow(REF_MPI ref_mpi,int argc,char **argv)

{
  char *filename;
  char *filename_00;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  REF_GRID_conflict local_488;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pos;
  char *mesher_options;
  char *mesher;
  REF_GRID_conflict ref_grid;
  size_t end_of_string;
  char project [1000];
  char *in_file;
  char *out_file;
  char **argv_local;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  mesher = (char *)0x0;
  mesher_options = "tetgen";
  _ref_private_macro_code_rss = (char *)0x0;
  if (1 < ref_mpi->n) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x81f,"grow",6,"ref grow is not parallel");
    return 6;
  }
  if (3 < argc) {
    filename = argv[2];
    filename_00 = argv[3];
    sVar3 = strlen(argv[2]);
    if (sVar3 < 0x400) {
      local_488 = (REF_GRID_conflict)strlen(argv[2]);
    }
    else {
      local_488 = (REF_GRID_conflict)0x3ff;
    }
    ref_grid = local_488;
    if (((REF_GRID_conflict)0x6 < local_488) &&
       (iVar1 = strncmp(argv[2] + (long)((long)&local_488[-1].twod + 2),".meshb",6), iVar1 == 0)) {
      strncpy((char *)&end_of_string,argv[2],(size_t)((long)&ref_grid[-1].twod + 2));
      ((undefined1 *)((long)ref_grid[-4].cell + 2))[(long)register0x00000020] = 0;
      printf("import %s\n",filename);
      uVar2 = ref_import_by_extension((REF_GRID *)&mesher,ref_mpi,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x82c,"grow",(ulong)uVar2,"load surface");
        return uVar2;
      }
      uVar2 = ref_args_find(argc,argv,"--mesher",&ref_private_macro_code_rss_1);
      if ((uVar2 != 0) && (uVar2 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x82e,"grow",(ulong)uVar2,"arg search");
        return uVar2;
      }
      if (((ref_private_macro_code_rss_1 != -1) && (ref_private_macro_code_rss_1 < argc + -1)) &&
         (mesher_options = argv[ref_private_macro_code_rss_1 + 1], ref_mpi->id == 0)) {
        printf("--mesher %s requested\n",mesher_options);
      }
      uVar2 = ref_args_find(argc,argv,"--mesher-options",&ref_private_macro_code_rss_1);
      if ((uVar2 != 0) && (uVar2 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x835,"grow",(ulong)uVar2,"arg search");
        return uVar2;
      }
      if (((ref_private_macro_code_rss_1 != -1) && (ref_private_macro_code_rss_1 < argc + -1)) &&
         (_ref_private_macro_code_rss = argv[ref_private_macro_code_rss_1 + 1], ref_mpi->id == 0)) {
        printf("--mesher-options %s requested\n",_ref_private_macro_code_rss);
      }
      iVar1 = strncmp(mesher_options,"t",1);
      if (iVar1 == 0) {
        if (ref_mpi->id == 0) {
          printf("fill volume with TetGen\n");
          uVar2 = ref_geom_tetgen_volume
                            ((REF_GRID)mesher,(char *)&end_of_string,_ref_private_macro_code_rss);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x841,"grow",(ulong)uVar2,"tetgen surface to volume");
            report_interections((REF_GRID_conflict)mesher,(char *)&end_of_string);
            return uVar2;
          }
        }
        ref_mpi_stopwatch_stop(ref_mpi,"tetgen volume");
      }
      else {
        iVar1 = strncmp(mesher_options,"a",1);
        if (iVar1 != 0) {
          printf("mesher \'%s\' not implemented\n",mesher_options);
          goto LAB_001188fa;
        }
        if (ref_mpi->id == 0) {
          printf("fill volume with AFLR3\n");
          uVar2 = ref_geom_aflr_volume
                            ((REF_GRID)mesher,(char *)&end_of_string,_ref_private_macro_code_rss);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x849,"grow",(ulong)uVar2,"aflr surface to volume");
            report_interections((REF_GRID_conflict)mesher,(char *)&end_of_string);
            return uVar2;
          }
        }
        ref_mpi_stopwatch_stop(ref_mpi,"aflr volume");
      }
      mesher[0x10c] = '\0';
      mesher[0x10d] = '\0';
      mesher[0x10e] = '\0';
      mesher[0x10f] = '\0';
      uVar2 = ref_validation_boundary_face((REF_GRID)mesher);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x852,"grow",(ulong)uVar2,"boundary-interior connectivity");
        return uVar2;
      }
      ref_mpi_stopwatch_stop(*(REF_MPI *)mesher,"boundary-volume check");
      uVar2 = ref_split_edge_geometry((REF_GRID)mesher);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x855,"grow",(ulong)uVar2,"split geom");
        return uVar2;
      }
      ref_mpi_stopwatch_stop(*(REF_MPI *)mesher,"split geom");
      uVar2 = ref_node_synchronize_globals(*(REF_NODE *)(mesher + 8));
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x858,"grow",(ulong)uVar2,"sync glob");
        return uVar2;
      }
      printf("export %s\n",filename_00);
      uVar2 = ref_export_by_extension((REF_GRID)mesher,filename_00);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x85b,"grow",(ulong)uVar2,"vol export");
        return uVar2;
      }
      uVar2 = ref_validation_cell_volume((REF_GRID)mesher);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x85d,"grow",(ulong)uVar2,"vol");
        return uVar2;
      }
      uVar2 = ref_grid_free((REF_GRID)mesher);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x85f,"grow",(ulong)uVar2,"create");
        return uVar2;
      }
      return 0;
    }
  }
LAB_001188fa:
  if (ref_mpi->id == 0) {
    grow_help(*argv);
  }
  return 1;
}

Assistant:

static REF_STATUS grow(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_file;
  char *in_file;
  char project[1000];
  size_t end_of_string;
  REF_GRID ref_grid = NULL;
  const char *mesher = "tetgen";
  const char *mesher_options = NULL;
  REF_INT pos;

  if (ref_mpi_para(ref_mpi)) {
    RSS(REF_IMPLEMENT, "ref grow is not parallel");
  }
  if (argc < 4) goto shutdown;
  in_file = argv[2];
  out_file = argv[3];
  end_of_string = MIN(1023, strlen(argv[2]));
  if (7 > end_of_string ||
      strncmp(&(argv[2][end_of_string - 6]), ".meshb", 6) != 0)
    goto shutdown;
  strncpy(project, argv[2], end_of_string - 6);
  project[end_of_string - 6] = '\0';

  printf("import %s\n", in_file);
  RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "load surface");

  RXS(ref_args_find(argc, argv, "--mesher", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    mesher = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) printf("--mesher %s requested\n", mesher);
  }

  RXS(ref_args_find(argc, argv, "--mesher-options", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    mesher_options = argv[pos + 1];
    if (ref_mpi_once(ref_mpi))
      printf("--mesher-options %s requested\n", mesher_options);
  }

  if (strncmp(mesher, "t", 1) == 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("fill volume with TetGen\n");
      RSB(ref_geom_tetgen_volume(ref_grid, project, mesher_options),
          "tetgen surface to volume",
          { report_interections(ref_grid, project); });
    }
    ref_mpi_stopwatch_stop(ref_mpi, "tetgen volume");
  } else if (strncmp(mesher, "a", 1) == 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("fill volume with AFLR3\n");
      RSB(ref_geom_aflr_volume(ref_grid, project, mesher_options),
          "aflr surface to volume",
          { report_interections(ref_grid, project); });
    }
    ref_mpi_stopwatch_stop(ref_mpi, "aflr volume");
  } else {
    printf("mesher '%s' not implemented\n", mesher);
    goto shutdown;
  }

  ref_grid_surf(ref_grid) = REF_FALSE; /* needed until vol mesher para */
  RSS(ref_validation_boundary_face(ref_grid), "boundary-interior connectivity");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "boundary-volume check");

  RSS(ref_split_edge_geometry(ref_grid), "split geom");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "split geom");

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  printf("export %s\n", out_file);
  RSS(ref_export_by_extension(ref_grid, out_file), "vol export");

  RSS(ref_validation_cell_volume(ref_grid), "vol");

  RSS(ref_grid_free(ref_grid), "create");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) grow_help(argv[0]);
  return REF_FAILURE;
}